

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::AndroidLogConfig::ParseFromArray
          (AndroidLogConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pAVar2;
  iterator __position;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  long lVar7;
  ulong *extraout_RDX;
  ulong *puVar8;
  ulong *puVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong *puVar15;
  uint uVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  ulong *puVar17;
  ulong uVar18;
  ulong *puVar19;
  bool bVar20;
  ulong *local_70;
  ulong local_68;
  Field local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
  *local_38;
  
  pAVar2 = (this->log_ids_).
           super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->log_ids_).
      super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar2) {
    (this->log_ids_).
    super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar2;
  }
  local_38 = &this->log_ids_;
  this_00 = &this->filter_tags_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->filter_tags_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar17 = (ulong *)(size + (long)raw);
  puVar8 = extraout_RDX;
  do {
    lVar7 = 7;
    if (puVar17 <= raw) goto LAB_002384cb;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar14 = (ulong *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar5 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar9 = puVar14;
      for (; (uVar12 = uVar5, puVar19 = puVar9, (char)bVar1 < '\0' &&
             (bVar20 = 0x38 < lVar7 - 7U, bVar10 = bVar20 || puVar17 <= puVar9, puVar8 = puVar9,
             uVar12 = 0, puVar19 = puVar14, !bVar20 && puVar17 > puVar9)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar9;
        puVar9 = (ulong *)((long)puVar9 + 1);
        uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
        puVar8 = puVar9;
      }
      puVar14 = puVar19;
      if (bVar10) {
        puVar14 = (ulong *)raw;
        uVar12 = 0;
      }
      if (puVar14 == (ulong *)raw) goto LAB_002384cb;
    }
    uVar4 = (uint)(uVar12 >> 3);
    if ((uVar4 == 0) || (puVar17 <= puVar14)) {
switchD_00238333_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_58.int_value_ = 0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        uVar18 = 0;
        bVar10 = puVar14 >= puVar17;
        if (puVar14 < puVar17) {
          puVar8 = (ulong *)((long)puVar14 + 1);
          uVar5 = (ulong)((byte)*puVar14 & 0x7f);
          uVar11 = uVar5;
          uVar16 = 0;
          if ((char)(byte)*puVar14 < '\0') {
            uVar11 = 0;
            uVar16 = 0;
            lVar7 = 7;
            puVar9 = puVar8;
            do {
              bVar20 = 0x38 < lVar7 - 7U;
              bVar10 = bVar20 || puVar17 <= puVar9;
              if (bVar20 || puVar17 <= puVar9) goto LAB_002384d1;
              uVar3 = *puVar9;
              puVar9 = (ulong *)((long)puVar9 + 1);
              uVar5 = uVar5 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar7 & 0x3f);
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar3 < '\0');
            uVar11 = uVar5 & 0xffffffff;
            puVar8 = puVar9;
            uVar16 = (uint)(uVar5 >> 0x20);
          }
        }
        else {
          uVar11 = 0;
          uVar16 = 0;
        }
LAB_002384d1:
        uVar5 = (ulong)uVar16;
        if (bVar10) {
          puVar8 = puVar14;
          uVar5 = uVar18;
          uVar11 = uVar18;
        }
        local_70 = puVar14;
        if (puVar8 != puVar14) goto LAB_00238503;
        uVar12 = 0;
        bVar10 = false;
        local_58.int_value_ = uVar18;
        goto LAB_00238545;
      case 1:
        puVar8 = puVar14 + 1;
        if (puVar17 < puVar8) {
LAB_002384cb:
          uVar12 = 0;
          bVar10 = false;
          local_58.int_value_ = 0;
          goto LAB_00238545;
        }
        uVar11 = *puVar14;
        uVar5 = uVar11 >> 0x20;
        break;
      case 2:
        bVar10 = puVar14 >= puVar17;
        uVar11 = local_68;
        if (puVar14 < puVar17) {
          puVar9 = (ulong *)((long)puVar14 + 1);
          uVar5 = (ulong)((byte)*puVar14 & 0x7f);
          puVar8 = puVar9;
          uVar11 = uVar5;
          if ((char)(byte)*puVar14 < '\0') {
            lVar7 = 7;
            puVar19 = puVar9;
            do {
              bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar19;
              puVar8 = puVar9;
              uVar11 = local_68;
              if (bVar10) break;
              uVar18 = *puVar19;
              puVar8 = (ulong *)((long)puVar19 + 1);
              uVar5 = uVar5 | (ulong)((byte)uVar18 & 0x7f) << ((byte)lVar7 & 0x3f);
              lVar7 = lVar7 + 7;
              puVar19 = puVar8;
              uVar11 = uVar5;
            } while ((char)(byte)uVar18 < '\0');
          }
        }
        uVar5 = 0;
        local_68 = uVar11;
        if (bVar10) {
          puVar8 = puVar14;
          local_68 = uVar5;
        }
        if (puVar8 == puVar14) {
          uVar11 = 0;
          bVar10 = false;
          uVar18 = 0;
        }
        else {
          bVar10 = local_68 <= (ulong)((long)puVar17 - (long)puVar8);
          if (bVar10) {
            uVar5 = (ulong)puVar8 >> 0x20;
            uVar11 = (ulong)puVar8 & 0xffffffff;
            puVar8 = (ulong *)((long)puVar8 + local_68);
            uVar18 = local_68;
          }
          else {
            uVar5 = 0;
            uVar11 = 0;
            uVar18 = 0;
          }
        }
        local_70 = puVar14;
        if (!bVar10) goto LAB_002384cb;
        goto LAB_00238503;
      default:
        goto switchD_00238333_caseD_3;
      case 5:
        puVar8 = (ulong *)((long)puVar14 + 4);
        uVar5 = 0;
        if (puVar17 < puVar8) goto LAB_002384cb;
        uVar11 = (ulong)(uint)*puVar14;
      }
      uVar18 = 0;
LAB_00238503:
      bVar10 = true;
      raw = puVar8;
      if ((uVar4 < 0x10000) && (uVar18 < 0x10000000)) {
        local_58.int_value_ = uVar11 & 0xffffffff | uVar5 << 0x20;
        uVar12 = uVar18 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_58.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_00238545:
    if (!bVar10) {
      local_58.size_ = (uint32_t)uVar12;
      local_58.type_ = (uint8_t)(uVar12 >> 0x30);
      local_58.id_ = (uint16_t)(uVar12 >> 0x20);
      local_40 = this_00;
      local_48 = dst;
      do {
        if (local_58.id_ == 0) {
          return puVar17 == (ulong *)raw;
        }
        uVar6 = (ushort)(uVar12 >> 0x20);
        if (uVar6 < 5) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        if (uVar6 == 4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(this_00);
          protozero::Field::get
                    (&local_58,
                     (this->filter_tags_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
        }
        else {
          uVar4 = (uint)(uVar12 >> 0x20) & 0xffff;
          if (uVar4 == 3) {
            this->min_prio_ = (AndroidLogId)local_58.int_value_;
          }
          else if (uVar4 == 1) {
            __position._M_current =
                 (this->log_ids_).
                 super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->log_ids_).
                super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
              ::_M_realloc_insert<>(local_38,__position);
            }
            else {
              *__position._M_current = LID_DEFAULT;
              (this->log_ids_).
              super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            (this->log_ids_).
            super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1] = (AndroidLogId)local_58.int_value_;
          }
          else {
            protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,dst);
          }
        }
        do {
          if (puVar17 <= raw) {
LAB_002389f8:
            local_58.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
            goto LAB_00238a03;
          }
          uVar12 = (ulong)(char)(byte)*raw;
          puVar8 = (ulong *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar5;
            puVar14 = puVar8;
            if ((char)(byte)*raw < '\0') {
              lVar7 = 7;
              puVar9 = puVar8;
              do {
                bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar9;
                uVar12 = 0;
                puVar14 = puVar8;
                if (bVar10) break;
                uVar11 = *puVar9;
                puVar14 = (ulong *)((long)puVar9 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar11 & 0x7f) << ((byte)lVar7 & 0x3f);
                lVar7 = lVar7 + 7;
                uVar12 = uVar5;
                puVar9 = puVar14;
              } while ((char)(byte)uVar11 < '\0');
            }
            puVar8 = puVar14;
            if (bVar10) {
              puVar8 = (ulong *)raw;
              uVar12 = 0;
            }
            if (puVar8 == (ulong *)raw) goto LAB_002389f8;
          }
          bVar10 = false;
          uVar4 = (uint)(uVar12 >> 3);
          puVar14 = (ulong *)raw;
          if ((uVar4 == 0) || (puVar17 <= puVar8)) goto switchD_00238759_caseD_3;
          bVar10 = false;
          switch((uint)uVar12 & 7) {
          case 0:
            puVar15 = (ulong *)0x0;
            bVar10 = puVar8 >= puVar17;
            if (puVar8 < puVar17) {
              puVar9 = (ulong *)((long)puVar8 + 1);
              uVar16 = (byte)*puVar8 & 0x7f;
              uVar5 = (ulong)uVar16;
              puVar19 = (ulong *)(ulong)uVar16;
              puVar14 = puVar9;
              uVar16 = 0;
              if ((char)(byte)*puVar8 < '\0') {
                puVar19 = (ulong *)0x0;
                lVar7 = 7;
                puVar13 = puVar9;
                do {
                  bVar20 = 0x38 < lVar7 - 7U;
                  bVar10 = bVar20 || puVar17 <= puVar13;
                  puVar14 = puVar9;
                  uVar16 = 0;
                  if (bVar20 || puVar17 <= puVar13) break;
                  bVar1 = (byte)*puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                  lVar7 = lVar7 + 7;
                  if (-1 < (char)bVar1) {
                    puVar19 = (ulong *)(uVar5 & 0xffffffff);
                  }
                  puVar14 = puVar13;
                  uVar16 = (uint)(uVar5 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              puVar19 = (ulong *)0x0;
              uVar16 = 0;
            }
            if (bVar10) {
              puVar19 = puVar15;
            }
            puVar9 = (ulong *)(ulong)uVar16;
            if (bVar10) {
              puVar14 = puVar8;
              puVar9 = puVar15;
            }
            this_00 = local_40;
            dst = local_48;
            if (puVar14 == puVar8) {
LAB_00238900:
              local_58.int_value_ = 0;
              uVar12 = 0;
              bVar10 = false;
              goto LAB_00238a03;
            }
            break;
          case 1:
            puVar14 = puVar8 + 1;
            if (puVar17 < puVar14) {
LAB_002386ee:
              uVar12 = 0;
              local_58.int_value_ = 0;
              bVar10 = false;
              goto LAB_00238a03;
            }
            puVar19 = (ulong *)*puVar8;
            puVar9 = (ulong *)((ulong)puVar19 >> 0x20);
            goto LAB_002387bd;
          case 2:
            bVar10 = puVar8 >= puVar17;
            puVar9 = local_70;
            if (puVar8 < puVar17) {
              puVar19 = (ulong *)((long)puVar8 + 1);
              puVar15 = (ulong *)(ulong)((byte)*puVar8 & 0x7f);
              puVar14 = puVar19;
              puVar9 = puVar15;
              if ((char)(byte)*puVar8 < '\0') {
                lVar7 = 7;
                puVar13 = puVar19;
                do {
                  bVar10 = 0x38 < lVar7 - 7U || puVar17 <= puVar13;
                  puVar14 = puVar19;
                  puVar9 = local_70;
                  if (bVar10) break;
                  uVar5 = *puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  puVar15 = (ulong *)((ulong)puVar15 |
                                     (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar7 & 0x3f));
                  lVar7 = lVar7 + 7;
                  puVar14 = puVar13;
                  puVar9 = puVar15;
                } while ((char)(byte)uVar5 < '\0');
              }
            }
            local_70 = puVar9;
            if (bVar10) {
              puVar14 = puVar8;
              local_70 = (ulong *)0x0;
            }
            if ((puVar14 == puVar8) || ((ulong *)((long)puVar17 - (long)puVar14) < local_70)) {
              puVar19 = (ulong *)0x0;
              puVar9 = (ulong *)0x0;
              bVar10 = false;
              puVar15 = (ulong *)0x0;
            }
            else {
              puVar9 = (ulong *)((ulong)puVar14 >> 0x20);
              puVar19 = (ulong *)((ulong)puVar14 & 0xffffffff);
              puVar14 = (ulong *)((long)puVar14 + (long)local_70);
              bVar10 = true;
              puVar15 = local_70;
            }
            if (!bVar10) goto LAB_00238900;
            break;
          default:
            goto switchD_00238759_caseD_3;
          case 5:
            puVar14 = (ulong *)((long)puVar8 + 4);
            puVar9 = (ulong *)0x0;
            if (puVar17 < puVar14) goto LAB_002386ee;
            puVar19 = (ulong *)(ulong)(uint)*puVar8;
LAB_002387bd:
            puVar15 = (ulong *)0x0;
          }
          bVar10 = true;
          if ((uVar4 < 0x10000) && (puVar15 < (ulong *)0x10000000)) {
            local_58.int_value_ = (ulong)puVar19 & 0xffffffff | (long)puVar9 << 0x20;
            uVar12 = (ulong)puVar15 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
            bVar10 = false;
            raw = puVar14;
          }
          else {
switchD_00238759_caseD_3:
            local_58.int_value_ = 0;
            uVar12 = 0;
            raw = puVar14;
          }
LAB_00238a03:
        } while (bVar10);
        local_58.size_ = (uint32_t)uVar12;
        local_58.type_ = (uint8_t)(uVar12 >> 0x30);
        local_58.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool AndroidLogConfig::ParseFromArray(const void* raw, size_t size) {
  log_ids_.clear();
  filter_tags_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* log_ids */:
        log_ids_.emplace_back();
        field.get(&log_ids_.back());
        break;
      case 3 /* min_prio */:
        field.get(&min_prio_);
        break;
      case 4 /* filter_tags */:
        filter_tags_.emplace_back();
        field.get(&filter_tags_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}